

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBox.h
# Opt level: O2

void __thiscall chrono::geometry::ChRoundedBox::ChRoundedBox(ChRoundedBox *this)

{
  (this->super_ChVolume).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_0118b3e8
  ;
  (this->Size).m_data[0] = VNULL;
  (this->Size).m_data[1] = DAT_011dd3e0;
  (this->Size).m_data[2] = DAT_011dd3e8;
  this->radsphere = 0.0;
  return;
}

Assistant:

ChRoundedBox(const ChVector<>& lengths, double radsphere) : Size(0.5 * lengths), radsphere(radsphere) {}